

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EvalContext.h
# Opt level: O2

void __thiscall
slang::ast::EvalContext::EvalContext
          (EvalContext *this,ASTContext *astCtx,bitmask<slang::ast::EvalFlags> flags)

{
  Scope *pSVar1;
  underlying_type uVar2;
  Symbol *pSVar3;
  RandomizeDetails *pRVar4;
  SymbolIndex SVar5;
  undefined4 uVar6;
  
  (this->astCtx).assertionInstance = astCtx->assertionInstance;
  pSVar1 = (astCtx->scope).ptr;
  SVar5 = astCtx->lookupIndex;
  uVar6 = *(undefined4 *)&astCtx->field_0xc;
  uVar2 = (astCtx->flags).m_bits;
  pSVar3 = astCtx->instanceOrProc;
  pRVar4 = astCtx->randomizeDetails;
  (this->astCtx).firstTempVar = astCtx->firstTempVar;
  (this->astCtx).randomizeDetails = pRVar4;
  (this->astCtx).flags.m_bits = uVar2;
  (this->astCtx).instanceOrProc = pSVar3;
  (this->astCtx).scope.ptr = pSVar1;
  (this->astCtx).lookupIndex = SVar5;
  *(undefined4 *)&(this->astCtx).field_0xc = uVar6;
  (this->flags).m_bits = flags.m_bits;
  *(undefined8 *)&this->steps = 0;
  *(undefined8 *)((long)&this->disableTarget + 4) = 0;
  *(undefined4 *)((long)&this->queueTarget + 4) = 0;
  (this->stack).super_SmallVectorBase<slang::ast::EvalContext::Frame>.data_ =
       (pointer)(this->stack).super_SmallVectorBase<slang::ast::EvalContext::Frame>.firstElement;
  (this->stack).super_SmallVectorBase<slang::ast::EvalContext::Frame>.len = 0;
  (this->stack).super_SmallVectorBase<slang::ast::EvalContext::Frame>.cap = 2;
  (this->lvalStack).super_SmallVectorBase<slang::ast::LValue_*>.data_ =
       (pointer)(this->lvalStack).super_SmallVectorBase<slang::ast::LValue_*>.firstElement;
  (this->lvalStack).super_SmallVectorBase<slang::ast::LValue_*>.len = 0;
  (this->lvalStack).super_SmallVectorBase<slang::ast::LValue_*>.cap = 5;
  (this->diags).super_SmallVector<slang::Diagnostic,_2UL>.super_SmallVectorBase<slang::Diagnostic>.
  data_ = (pointer)(this->diags).super_SmallVector<slang::Diagnostic,_2UL>.
                   super_SmallVectorBase<slang::Diagnostic>.firstElement;
  (this->diags).super_SmallVector<slang::Diagnostic,_2UL>.super_SmallVectorBase<slang::Diagnostic>.
  len = 0;
  (this->diags).super_SmallVector<slang::Diagnostic,_2UL>.super_SmallVectorBase<slang::Diagnostic>.
  cap = 2;
  (this->warnings).super_SmallVector<slang::Diagnostic,_2UL>.
  super_SmallVectorBase<slang::Diagnostic>.data_ =
       (pointer)(this->warnings).super_SmallVector<slang::Diagnostic,_2UL>.
                super_SmallVectorBase<slang::Diagnostic>.firstElement;
  (this->warnings).super_SmallVector<slang::Diagnostic,_2UL>.
  super_SmallVectorBase<slang::Diagnostic>.len = 0;
  (this->warnings).super_SmallVector<slang::Diagnostic,_2UL>.
  super_SmallVectorBase<slang::Diagnostic>.cap = 2;
  (this->disableRange).startLoc = (SourceLocation)0x0;
  (this->disableRange).endLoc = (SourceLocation)0x0;
  this->backtraceReported = false;
  return;
}

Assistant:

explicit EvalContext(const ASTContext& astCtx, bitmask<EvalFlags> flags = {}) :
        astCtx(astCtx), flags(flags) {}